

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O3

parser_error parse_curse_msg(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  char *s2;
  char *pcVar3;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar3 = *(char **)(*(long *)((long)pvVar2 + 0x18) + 0xf8);
    s2 = parser_getstr(p,"text");
    pcVar3 = string_append(pcVar3,s2);
    *(char **)(*(long *)((long)pvVar2 + 0x18) + 0xf8) = pcVar3;
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_curse_msg(struct parser *p) {
	struct curse *curse = parser_priv(p);

	if (!curse) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	curse->obj->effect_msg = string_append(curse->obj->effect_msg,
		parser_getstr(p, "text"));
	return PARSE_ERROR_NONE;
}